

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

shared_ptr<gui::Slider> __thiscall
gui::Slider::create(Slider *this,shared_ptr<gui::SliderStyle> *style,String *name)

{
  Slider *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Slider> sVar1;
  __shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (Slider *)operator_new(0x260);
  std::__shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>);
  Slider(this_00,(shared_ptr<gui::SliderStyle> *)&local_40,name);
  std::__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Slider,void>
            ((__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Slider>)sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Slider> Slider::create(std::shared_ptr<SliderStyle> style, const sf::String& name) {
    return std::shared_ptr<Slider>(new Slider(style, name));
}